

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zueci.c
# Opt level: O0

int zueci_gb18030_u(uchar *src,zueci_u32 len,uint flags,zueci_u32 *p_u)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint mb4_00;
  int iVar5;
  zueci_u32 zVar6;
  zueci_u32 zVar7;
  uint *in_RCX;
  uint in_ESI;
  byte *in_RDI;
  int m_1;
  int e_1;
  int s_1;
  int m;
  int e;
  int s;
  zueci_u32 mb4;
  zueci_u16 mb2;
  int ret;
  uchar c4;
  uchar c3;
  uchar c2;
  uchar c1;
  int local_44;
  int local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar9;
  uint in_stack_ffffffffffffffd0;
  zueci_u32 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  byte bVar10;
  int local_4;
  
  bVar10 = *in_RDI;
  if (bVar10 < 0x80) {
    *in_RCX = (uint)bVar10;
    local_4 = 1;
  }
  else if (((in_ESI < 2) || (bVar10 < 0x81)) || (bVar10 == 0xff)) {
    local_4 = 0;
  }
  else {
    local_4 = zueci_gbk_u((uchar *)CONCAT17(bVar10,CONCAT16(in_stack_ffffffffffffffde,
                                                            CONCAT15(in_stack_ffffffffffffffdd,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8)))),
                          in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,
                          (zueci_u32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         );
    if (local_4 == 0) {
      bVar1 = in_RDI[1];
      if (((in_ESI < 4) || (0x39 < bVar1)) ||
         ((bVar1 < 0x30 || ((bVar10 < 0x81 || (0xe3 < bVar10)))))) {
        if ((bVar1 < 0x40) || ((bVar1 == 0x7f || (bVar1 == 0xff)))) {
          local_4 = 0;
        }
        else if ((((bVar10 < 0xaa) || (0xaf < bVar10)) && ((bVar10 < 0xf8 || (0xfe < bVar10)))) ||
                ((bVar1 < 0xa1 || (0xfe < bVar1)))) {
          if ((bVar10 < 0xa1) || ((0xa7 < bVar10 || (0xa1 < bVar1)))) {
            if ((bVar10 == 0xfe) && ((0x50 < bVar1 && (bVar1 < 0x92)))) {
              if (bVar1 == 0x51) {
                *in_RCX = 0x20087;
                return 2;
              }
              if (bVar1 == 0x52) {
                *in_RCX = 0x20089;
                return 2;
              }
              if (bVar1 == 0x53) {
                *in_RCX = 0x200cc;
                return 2;
              }
              if (bVar1 == 0x6c) {
                *in_RCX = 0x215d7;
                return 2;
              }
              if (bVar1 == 0x76) {
                *in_RCX = 0x2298f;
                return 2;
              }
              if (bVar1 == 0x91) {
                *in_RCX = 0x241fe;
                return 2;
              }
            }
            uVar4 = CONCAT11(bVar10,bVar1);
            if ((0xa2aa < uVar4) && (uVar4 < 0xfea1)) {
              local_40 = 0;
              local_44 = 0xfe;
              while (local_40 <= local_44) {
                iVar5 = local_40 + local_44 >> 1;
                if (zueci_gb18030_2_mb_mb[iVar5] < uVar4) {
                  local_40 = iVar5 + 1;
                }
                else {
                  if (zueci_gb18030_2_mb_mb[iVar5] <= uVar4) {
                    *in_RCX = (uint)zueci_gb18030_2_mb_u[iVar5];
                    return 2;
                  }
                  local_44 = iVar5 + -1;
                }
              }
            }
            local_4 = 0;
          }
          else {
            *in_RCX = ((bVar10 - 0xa1) * 0x60 + (uint)bVar1 + 0xe486) - (uint)(0x7f < bVar1);
            local_4 = 2;
          }
        }
        else {
          iVar5 = 0xaa;
          if (0xf7 < bVar10) {
            iVar5 = 0xf2;
          }
          *in_RCX = ((uint)bVar10 - iVar5) * 0x5e + (uint)bVar1 + 0xdf5f;
          local_4 = 2;
        }
      }
      else {
        bVar2 = in_RDI[2];
        bVar3 = in_RDI[3];
        mb4_00 = (uint)bVar10 << 0x18 | (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
        if ((((mb4_00 < 0x81308130) ||
             ((((0x8431a439 < mb4_00 && (mb4_00 < 0x90308130)) || (0xe3329a35 < mb4_00)) ||
              ((bVar2 < 0x81 || (0xfe < bVar2)))))) || (bVar3 < 0x30)) || (0x39 < bVar3)) {
          local_4 = 0;
        }
        else if (mb4_00 == 0x8135f437) {
          *in_RCX = 0xe7c7;
          local_4 = 4;
        }
        else {
          if (bVar10 < 0x90) {
            iVar9 = 0;
            iVar5 = 0xcd;
            while (iVar8 = iVar5, iVar9 < iVar8) {
              iVar5 = iVar9 + iVar8 >> 1;
              if (zueci_gb18030_4_mb_e[iVar5] < mb4_00) {
                iVar9 = iVar5 + 1;
                iVar5 = iVar8;
              }
            }
            uVar4 = zueci_gb18030_4_u_e[iVar9];
            zVar6 = zueci_gb18030_mb4_u(zueci_gb18030_4_mb_e[iVar9]);
            zVar7 = zueci_gb18030_mb4_u(mb4_00);
            *in_RCX = (uint)uVar4 - (zVar6 - zVar7);
          }
          else {
            *in_RCX = (((bVar10 - 0x90) * 10 + (bVar1 - 0x30)) * 0x7e + (bVar2 - 0x81)) * 10 +
                      (uint)bVar3 + 0xffd0;
          }
          local_4 = 4;
        }
      }
    }
  }
  return local_4;
}

Assistant:

static int zueci_gb18030_u(const unsigned char *src, const zueci_u32 len, const unsigned int flags, zueci_u32 *p_u) {
    unsigned char c1, c2, c3, c4;
    int ret;
    zueci_u16 mb2;
    zueci_u32 mb4;

    (void)flags;
    assert(len);

    c1 = src[0];
    if (c1 < 0x80) {
        *p_u = c1;
        return 1;
    }
    if (len < 2 || c1 < 0x81 || c1 == 0xFF) {
        return 0;
    }
    if ((ret = zueci_gbk_u(src, len, 0 /*flags*/, p_u))) {
        return ret;
    }
    c2 = src[1];
    if (len >= 4 && c2 <= 0x39 && c2 >= 0x30 && c1 >= 0x81 && c1 <= 0xE3) {
        c3 = src[2];
        c4 = src[3];
        mb4 = ZUECI_4BYTES_U32(c1, c2, c3, c4);
        if (mb4 < 0x81308130 || (mb4 > 0x8431A439 && mb4 < 0x90308130) || mb4 > 0xE3329A35
                || c3 < 0x81 || c3 > 0xFE || c4 < 0x30 || c4 > 0x39) {
            return 0;
        }
        if (mb4 == 0x8135F437) { /* PUA change to non-PUA, see Table 3-39, Lunde, 2nd ed. */
            *p_u = 0xE7C7;
            return 4;
        }
        if (c1 >= 0x90) { /* Non-BMP */
            *p_u = 0x10000 + (((c1 - 0x90) * 10 + (c2 - 0x30)) * 126 + (c3 - 0x81)) * 10 + c4 - 0x30;
        } else { /* BMP */
            int s = 0;
            int e = ZUECI_ASIZE(zueci_gb18030_4_mb_e) - 1;
            while (s < e) { /* Lower bound */
                const int m = (s + e) >> 1;
                if (zueci_gb18030_4_mb_e[m] < mb4) {
                    s = m + 1;
                } else {
                    e = m;
                }
            }
            assert(s < ZUECI_ASIZE(zueci_gb18030_4_mb_e));
            *p_u = zueci_gb18030_4_u_e[s] - (zueci_gb18030_mb4_u(zueci_gb18030_4_mb_e[s]) - zueci_gb18030_mb4_u(mb4));
        }
        return 4;
    }
    if (c2 < 0x40 || c2 == 0x7F || c2 == 0xFF) {
        return 0;
    }
    if (((c1 >= 0xAA && c1 <= 0xAF) || (c1 >= 0xF8 && c1 <= 0xFE)) && c2 >= 0xA1 && c2 <= 0xFE) { /* UDA-1/2 PUA */
        *p_u = 0xE000 + (0xFF - 0xA0 - 1) * (c1 - (c1 >= 0xF8 ? 0xF2 : 0xAA)) + c2 - 0xA1;
        return 2;
    }
    if (c1 >= 0xA1 && c1 <= 0xA7 && c2 <= 0xA1) { /* UDA-3 PUA */
        *p_u = 0xE4C6 + (0xA1 - 0x40 - 1) * (c1 - 0xA1) + c2 - 0x40 - (c2 > 0x7F);
        return 2;
    }
    if (c1 == 0xFE && c2 >= 0x51 && c2 <= 0x91) {
        /* Non-BMP that were PUA, see Table 3-37, Lunde, 2nd ed. */
        if (c2 == 0x51) {
            *p_u = 0x20087;
            return 2;
        }
        if (c2 == 0x52) {
            *p_u = 0x20089;
            return 2;
        }
        if (c2 == 0x53) {
            *p_u = 0x200CC;
            return 2;
        }
        if (c2 == 0x6C) {
            *p_u = 0x215D7;
            return 2;
        }
        if (c2 == 0x76) {
            *p_u = 0x2298F;
            return 2;
        }
        if (c2 == 0x91) {
            *p_u = 0x241FE;
            return 2;
        }
    }
    mb2 = ((zueci_u16) c1 << 8) | c2;
    if (mb2 >= zueci_gb18030_2_mb_mb[0] && mb2 <= zueci_gb18030_2_mb_mb[ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1]) {
        int s = 0;
        int e = ZUECI_ASIZE(zueci_gb18030_2_mb_mb) - 1;
        while (s <= e) {
            const int m = (s + e) >> 1;
            if (zueci_gb18030_2_mb_mb[m] < mb2) {
                s = m + 1;
            } else if (zueci_gb18030_2_mb_mb[m] > mb2) {
                e = m - 1;
            } else {
                *p_u = zueci_gb18030_2_mb_u[m];
                return 2;
            }
        }
    }
    return 0;
}